

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall
GlobOpt::TypeSpecializeIntDst
          (GlobOpt *this,Instr *instr,OpCode originalOpCode,Value *valToTransfer,Value *src1Value,
          Value *src2Value,BailOutKind bailOutKind,ValueType valueType,int32 newMin,int32 newMax,
          Value **pDstVal,AddSubConstantInfo *addSubConstantInfo)

{
  code *pcVar1;
  bool bVar2;
  bool isValueInfoPrecise;
  ValueType VVar3;
  undefined4 *puVar4;
  IntBounds *bounds;
  Value *pVVar5;
  RegOpnd *pRVar6;
  ulong uVar7;
  undefined6 in_register_00000012;
  ValueInfo *this_00;
  Value *src2Value_00;
  Opnd *this_01;
  undefined2 in_stack_00000012;
  IntConstantBounds local_70;
  Opnd *local_68;
  Value *local_60;
  uint local_58;
  int local_54;
  Value *local_50;
  int32 local_48;
  int32 local_44;
  GlobOpt *local_40;
  IntBounds *local_38;
  
  local_58 = (uint)CONCAT62(in_register_00000012,originalOpCode);
  local_48 = newMax;
  local_44 = newMin;
  local_50 = src2Value;
  bVar2 = ValueType::IsInt(&valueType);
  if ((!bVar2) &&
     ((bVar2 = ValueType::IsNumber(&valueType), !bVar2 ||
      (bVar2 = ValueType::IsLikelyInt(&valueType), (newMax != 0 || newMin != 0) || !bVar2)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2191,
                       "(valueType.IsInt() || (valueType.IsNumber() && valueType.IsLikelyInt() && newMin == 0 && newMax == 0))"
                       ,
                       "valueType.IsInt() || (valueType.IsNumber() && valueType.IsLikelyInt() && newMin == 0 && newMax == 0)"
                      );
    if (!bVar2) goto LAB_0043a774;
    *puVar4 = 0;
  }
  local_38 = (IntBounds *)valToTransfer;
  if (valToTransfer != src1Value && valToTransfer != (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2192,"(!valToTransfer || valToTransfer == src1Value)",
                       "!valToTransfer || valToTransfer == src1Value");
    if (!bVar2) goto LAB_0043a774;
    *puVar4 = 0;
  }
  if ((addSubConstantInfo != (AddSubConstantInfo *)0x0) &&
     (addSubConstantInfo->srcSym == (StackSym *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2193,"(!addSubConstantInfo || addSubConstantInfo->HasInfo())",
                       "!addSubConstantInfo || addSubConstantInfo->HasInfo()");
    if (!bVar2) goto LAB_0043a774;
    *puVar4 = 0;
  }
  this_01 = instr->m_dst;
  if (this_01 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    local_40 = this;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2196,"(dst)","dst");
    if (!bVar2) goto LAB_0043a774;
    *puVar4 = 0;
    this = local_40;
  }
  local_60 = src1Value;
  if (this->prePassLoop == (Loop *)0x0) {
    isValueInfoPrecise = true;
    bVar2 = false;
  }
  else {
    src2Value_00 = (Value *)0x0;
    pVVar5 = local_50;
    isValueInfoPrecise = IsPrepassSrcValueInfoPrecise(this,instr,src1Value,local_50,(bool *)0x0);
    VVar3 = GetPrepassValueTypeForDst
                      (this,(ValueType)SUB42(_valueType,0),instr,pVVar5,src2Value_00,
                       isValueInfoPrecise,false);
    _valueType = CONCAT22(in_stack_00000012,VVar3.field_0);
    bVar2 = this->prePassLoop != (Loop *)0x0;
  }
  if ((((this->field_0xf5 & 2) == 0) && (bVar2)) && (bVar2 = ValueType::IsInt(&valueType), !bVar2))
  {
    bVar2 = IR::Opnd::IsRegOpnd(this_01);
    if (!bVar2) {
      return;
    }
    pRVar6 = IR::Opnd::AsRegOpnd(this_01);
    ToVarRegOpnd(this,pRVar6,this->currentBlock);
    return;
  }
  if (addSubConstantInfo == (AddSubConstantInfo *)0x0) {
    bounds = (IntBounds *)0x0;
    if (local_38 == (IntBounds *)0x0) goto LAB_0043a47b;
LAB_0043a449:
    pVVar5 = ValueNumberTransferDst(this,instr,(Value *)local_38);
    *pDstVal = pVVar5;
    GlobOptBlockData::InsertNewValue(&this->currentBlock->globOptData,pVVar5,this_01);
  }
  else {
    bVar2 = AddSubConstantInfo::SrcValueIsLikelyConstant(addSubConstantInfo);
    if ((bVar2) || ((*(uint *)&this->field_0xf4 >> 0x14 & 1) == 0)) {
      bounds = (IntBounds *)0x0;
    }
    else {
      local_68 = this_01;
      local_40 = (GlobOpt *)instr;
      if ((*(uint *)&this->field_0xf4 & 4) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x21b3,"(!ignoredIntOverflowForCurrentInstr)",
                           "!ignoredIntOverflowForCurrentInstr");
        if (!bVar2) goto LAB_0043a774;
        *puVar4 = 0;
      }
      bVar2 = ValueType::IsInt(&valueType);
      bVar2 = (isValueInfoPrecise & bVar2) == 0;
      if (bVar2) {
        newMax = 0x7fffffff;
      }
      if (bVar2) {
        newMin = -0x80000000;
      }
      pVVar5 = AddSubConstantInfo::SrcValue(addSubConstantInfo);
      local_54 = AddSubConstantInfo::Offset(addSubConstantInfo);
      local_48 = newMax;
      local_44 = newMin;
      IntConstantBounds::IntConstantBounds(&local_70,newMin,newMax);
      bounds = IntBounds::Add(pVVar5,local_54,isValueInfoPrecise,&local_70,this->alloc);
      instr = (Instr *)local_40;
      this_01 = local_68;
    }
    if (local_38 != (IntBounds *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x21cc,"(!addSubConstantInfo)","!addSubConstantInfo");
      if (!bVar2) goto LAB_0043a774;
      *puVar4 = 0;
      goto LAB_0043a449;
    }
LAB_0043a47b:
    bVar2 = ValueType::IsInt(&valueType);
    pVVar5 = local_60;
    if ((isValueInfoPrecise & bVar2) == 1) {
      if (local_48 < 0 || 0 < local_44) {
LAB_0043a66b:
        bVar2 = false;
      }
      else {
        bVar2 = false;
        if ((ushort)local_58 < 0x34) {
          uVar7 = (ulong)(local_58 & 0xffff);
          if ((0x3410000000000U >> (uVar7 & 0x3f) & 1) == 0) {
            if (uVar7 == 0x2d) {
              if (local_60 == (Value *)0x0) {
                AssertCount = AssertCount + 1;
                local_40 = this;
                local_38 = bounds;
                Js::Throw::LogAssert();
                puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
                *puVar4 = 1;
                bVar2 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                   ,0x21d9,"(src1Value)","src1Value");
                if (!bVar2) goto LAB_0043a774;
                *puVar4 = 0;
                this = local_40;
                bounds = local_38;
              }
              if (local_50 == (Value *)0x0) {
                AssertCount = AssertCount + 1;
                local_40 = this;
                local_38 = bounds;
                Js::Throw::LogAssert();
                puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
                *puVar4 = 1;
                bVar2 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                   ,0x21da,"(src2Value)","src2Value");
                if (!bVar2) goto LAB_0043a774;
                *puVar4 = 0;
                this = local_40;
                bounds = local_38;
              }
              bVar2 = ValueInfo::WasNegativeZeroPreventedByBailout(pVVar5->valueInfo);
              if (!bVar2) goto LAB_0043a66b;
              this_00 = local_50->valueInfo;
            }
            else {
              bVar2 = false;
              if (uVar7 != 0x33) goto LAB_0043a66d;
              if (local_60 == (Value *)0x0) {
                AssertCount = AssertCount + 1;
                local_38 = bounds;
                Js::Throw::LogAssert();
                puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
                *puVar4 = 1;
                bVar2 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                   ,0x21e2,"(src1Value)","src1Value");
                if (!bVar2) goto LAB_0043a774;
                *puVar4 = 0;
                bounds = local_38;
              }
              this_00 = pVVar5->valueInfo;
            }
            bVar2 = ValueInfo::WasNegativeZeroPreventedByBailout(this_00);
          }
          else {
            bVar2 = (bool)((byte)(bailOutKind >> 0xc) & 1);
          }
        }
      }
LAB_0043a66d:
      if (bounds == (IntBounds *)0x0) {
        pVVar5 = NewIntRangeValue(this,local_44,local_48,bVar2,(Opnd *)0x0);
      }
      else {
LAB_0043a681:
        pVVar5 = NewIntBoundedValue(this,valueType,bounds,bVar2,(Opnd *)0x0);
      }
    }
    else {
      if (bounds != (IntBounds *)0x0) {
        bVar2 = false;
        goto LAB_0043a681;
      }
      pVVar5 = NewGenericValue(this,valueType);
    }
    *pDstVal = pVVar5;
  }
  if ((addSubConstantInfo != (AddSubConstantInfo *)0x0) || ((this->field_0xf4 & 0x40) != 0)) {
    TrackIntSpecializedAddSubConstant
              (this,instr,addSubConstantInfo,*pDstVal,bounds != (IntBounds *)0x0);
  }
  GlobOptBlockData::SetValue(&this->currentBlock->globOptData,*pDstVal,this_01);
  bVar2 = IR::Opnd::IsRegOpnd(this_01);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2200,"(dst->IsRegOpnd())","What else?");
    if (!bVar2) {
LAB_0043a774:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pRVar6 = IR::Opnd::AsRegOpnd(this_01);
  ToInt32Dst(this,instr,pRVar6,this->currentBlock);
  return;
}

Assistant:

void
GlobOpt::TypeSpecializeIntDst(IR::Instr* instr, Js::OpCode originalOpCode, Value* valToTransfer, Value *const src1Value, Value *const src2Value, const IR::BailOutKind bailOutKind, ValueType valueType, int32 newMin, int32 newMax, Value** pDstVal, const AddSubConstantInfo *const addSubConstantInfo)
{
    Assert(valueType.IsInt() || (valueType.IsNumber() && valueType.IsLikelyInt() && newMin == 0 && newMax == 0));
    Assert(!valToTransfer || valToTransfer == src1Value);
    Assert(!addSubConstantInfo || addSubConstantInfo->HasInfo());

    IR::Opnd *dst = instr->GetDst();
    Assert(dst);

    bool isValueInfoPrecise;
    if(IsLoopPrePass())
    {
        isValueInfoPrecise = IsPrepassSrcValueInfoPrecise(instr, src1Value, src2Value);
        valueType = GetPrepassValueTypeForDst(valueType, instr, src1Value, src2Value, isValueInfoPrecise);
    }
    else
    {
        isValueInfoPrecise = true;
    }

    // If dst has a circular reference in a loop, it probably won't get specialized. Don't mark the dst as type-specialized on
    // the pre-pass. With aggressive int spec though, it will take care of bailing out if necessary so there's no need to assume
    // that the dst will be a var even if it's live on the back-edge. Also if the op always produces an int32, then there's no
    // ambiguity in the dst's value type even in the prepass.
    if (!DoAggressiveIntTypeSpec() && this->IsLoopPrePass() && !valueType.IsInt())
    {
        if (dst->IsRegOpnd())
        {
            this->ToVarRegOpnd(dst->AsRegOpnd(), this->currentBlock);
        }
        return;
    }

    const IntBounds *dstBounds = nullptr;
    if(addSubConstantInfo && !addSubConstantInfo->SrcValueIsLikelyConstant() && DoTrackRelativeIntBounds())
    {
        Assert(!ignoredIntOverflowForCurrentInstr);

        // Track bounds for add or sub with a constant. For instance, consider (b = a + 2). The value of 'b' should track that
        // it is equal to (the value of 'a') + 2. Additionally, the value of 'b' should inherit the bounds of 'a', offset by
        // the constant value.
        if(!valueType.IsInt() || !isValueInfoPrecise)
        {
            newMin = INT32_MIN;
            newMax = INT32_MAX;
        }
        dstBounds =
            IntBounds::Add(
                addSubConstantInfo->SrcValue(),
                addSubConstantInfo->Offset(),
                isValueInfoPrecise,
                IntConstantBounds(newMin, newMax),
                alloc);
    }

    // Src1's value could change later in the loop, so the value wouldn't be the same for each
    // iteration.  Since we don't iterate over loops "while (!changed)", go conservative on the
    // pre-pass.
    if (valToTransfer)
    {
        // If this is just a copy, no need for creating a new value.
        Assert(!addSubConstantInfo);
        *pDstVal = this->ValueNumberTransferDst(instr, valToTransfer);
        CurrentBlockData()->InsertNewValue(*pDstVal, dst);
    }
    else if (valueType.IsInt() && isValueInfoPrecise)
    {
        bool wasNegativeZeroPreventedByBailout = false;
        if(newMin <= 0 && newMax >= 0)
        {
            switch(originalOpCode)
            {
                case Js::OpCode::Add_A:
                    // -0 + -0 == -0
                    Assert(src1Value);
                    Assert(src2Value);
                    wasNegativeZeroPreventedByBailout =
                        src1Value->GetValueInfo()->WasNegativeZeroPreventedByBailout() &&
                        src2Value->GetValueInfo()->WasNegativeZeroPreventedByBailout();
                    break;

                case Js::OpCode::Sub_A:
                    // -0 - 0 == -0
                    Assert(src1Value);
                    wasNegativeZeroPreventedByBailout = src1Value->GetValueInfo()->WasNegativeZeroPreventedByBailout();
                    break;

                case Js::OpCode::Neg_A:
                case Js::OpCode::Mul_A:
                case Js::OpCode::Div_A:
                case Js::OpCode::Rem_A:
                    wasNegativeZeroPreventedByBailout = !!(bailOutKind & IR::BailOutOnNegativeZero);
                    break;
            }
        }

        *pDstVal =
            dstBounds
                ? NewIntBoundedValue(valueType, dstBounds, wasNegativeZeroPreventedByBailout, nullptr)
                : NewIntRangeValue(newMin, newMax, wasNegativeZeroPreventedByBailout, nullptr);
    }
    else
    {
        *pDstVal = dstBounds ? NewIntBoundedValue(valueType, dstBounds, false, nullptr) : NewGenericValue(valueType);
    }

    if(addSubConstantInfo || updateInductionVariableValueNumber)
    {
        TrackIntSpecializedAddSubConstant(instr, addSubConstantInfo, *pDstVal, !!dstBounds);
    }

    CurrentBlockData()->SetValue(*pDstVal, dst);

    AssertMsg(dst->IsRegOpnd(), "What else?");
    this->ToInt32Dst(instr, dst->AsRegOpnd(), this->currentBlock);
}